

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_1::OutputCountShader::shadePrimitives
          (OutputCountShader *this,GeometryEmitter *output,int verticesIn,PrimitivePacket *packets,
          int numPackets,int invocationID)

{
  int iVar1;
  int iVar2;
  VertexPacket *pVVar3;
  PrimitivePacket *pPVar4;
  int iVar5;
  float fVar6;
  Vector<float,_4> res;
  Vec4 local_78;
  ulong local_68;
  ulong local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  if (0 < numPackets) {
    local_58 = ZEXT416((uint)(2.0 / (float)*(int *)&(this->super_ShaderProgram).field_0x154));
    iVar1 = this->m_patternMaxEmitCount;
    local_68 = (ulong)(uint)numPackets;
    local_60 = 0;
    do {
      iVar2 = (this->m_spec).pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[packets[local_60].primitiveIDIn];
      if (1 < iVar2) {
        pPVar4 = packets + local_60;
        pVVar3 = pPVar4->vertices[0];
        iVar5 = 0;
        do {
          fVar6 = ((float)iVar5 + (float)iVar5) * (2.0 / (float)iVar1);
          local_48 = ZEXT416((uint)fVar6);
          local_78.m_data[1] = (pVVar3->position).m_data[1] + 0.0;
          local_78.m_data[0] = fVar6 + (pVVar3->position).m_data[0];
          local_78.m_data[3] = (pVVar3->position).m_data[3] + 0.0;
          local_78.m_data[2] = (pVVar3->position).m_data[2] + 0.0;
          rr::GeometryEmitter::EmitVertex
                    (output,&local_78,pVVar3->pointSize,pVVar3->outputs,pPVar4->primitiveIDIn);
          local_78.m_data[1] = (pVVar3->position).m_data[1] + (float)local_58._0_4_;
          local_78.m_data[0] = (pVVar3->position).m_data[0] + (float)local_48._0_4_;
          local_78.m_data[3] = (pVVar3->position).m_data[3] + 0.0;
          local_78.m_data[2] = (pVVar3->position).m_data[2] + 0.0;
          rr::GeometryEmitter::EmitVertex
                    (output,&local_78,pVVar3->pointSize,pVVar3->outputs,pPVar4->primitiveIDIn);
          iVar5 = iVar5 + 1;
        } while (iVar2 / 2 != iVar5);
      }
      rr::GeometryEmitter::EndPrimitive(output);
      local_60 = local_60 + 1;
    } while (local_60 != local_68);
  }
  return;
}

Assistant:

void OutputCountShader::shadePrimitives (rr::GeometryEmitter& output, int verticesIn, const rr::PrimitivePacket* packets, const int numPackets, int invocationID) const
{
	DE_UNREF(verticesIn);
	DE_UNREF(invocationID);

	const float rowHeight	= 2.0f / (float)m_patternLength;
	const float colWidth	= 2.0f / (float)m_patternMaxEmitCount;

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		// Create triangle strip at this point
		const rr::VertexPacket*	vertex		= packets[packetNdx].vertices[0];
		const int				emitCount	= m_spec.pattern[packets[packetNdx].primitiveIDIn];

		for (int ndx = 0; ndx < emitCount / 2; ++ndx)
		{
			output.EmitVertex(vertex->position + tcu::Vec4(2 * (float)ndx * colWidth, 0.0,       0.0, 0.0), vertex->pointSize, vertex->outputs, packets[packetNdx].primitiveIDIn);
			output.EmitVertex(vertex->position + tcu::Vec4(2 * (float)ndx * colWidth, rowHeight, 0.0, 0.0), vertex->pointSize, vertex->outputs, packets[packetNdx].primitiveIDIn);
		}
		output.EndPrimitive();
	}
}